

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O2

LCC_API_VIRTUALIZATION_DETAIL_conflict __thiscall
license::os::ExecutionEnvironment::virtualization_detail(ExecutionEnvironment *this)

{
  bool bVar1;
  LCC_API_VIRTUALIZATION_DETAIL_conflict LVar2;
  string sys_vendor;
  string bios_vendor;
  string bios_description;
  
  std::__cxx11::string::string
            ((string *)&bios_description,(string *)&(this->m_dmi_info).m_bios_description);
  std::__cxx11::string::string((string *)&bios_vendor,(string *)&(this->m_dmi_info).m_bios_vendor);
  std::__cxx11::string::string((string *)&sys_vendor,(string *)&(this->m_dmi_info).m_sys_vendor);
  LVar2 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                       *)vm_vendors_abi_cxx11_,&bios_description);
  if (LVar2 == BARE_TO_METAL) {
    LVar2 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                         *)vm_vendors_abi_cxx11_,&bios_vendor);
    if (LVar2 == BARE_TO_METAL) {
      LVar2 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                           *)vm_vendors_abi_cxx11_,&sys_vendor);
      if (LVar2 == BARE_TO_METAL) {
        LVar2 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                             *)virtual_cpu_names_abi_cxx11_,&(this->m_cpu_info).m_vendor);
        if (LVar2 == BARE_TO_METAL) {
          LVar2 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                               *)virtual_cpu_names_abi_cxx11_,&(this->m_cpu_info).m_brand);
          if (LVar2 == BARE_TO_METAL) {
            bVar1 = CpuInfo::is_hypervisor_set(&this->m_cpu_info);
            if (!bVar1) {
              bVar1 = is_cloud(this);
              LVar2 = BARE_TO_METAL;
              if (!bVar1) goto LAB_00189912;
            }
            LVar2 = PRODUCT_EXPIRED;
          }
        }
      }
    }
  }
LAB_00189912:
  std::__cxx11::string::~string((string *)&sys_vendor);
  std::__cxx11::string::~string((string *)&bios_vendor);
  std::__cxx11::string::~string((string *)&bios_description);
  return LVar2;
}

Assistant:

LCC_API_VIRTUALIZATION_DETAIL ExecutionEnvironment::virtualization_detail() const {
	LCC_API_VIRTUALIZATION_DETAIL result = BARE_TO_METAL;
	const string bios_description = m_dmi_info.bios_description();
	const string bios_vendor = m_dmi_info.bios_vendor();
	const string sys_vendor = m_dmi_info.sys_vendor();
	if ((result = find_in_map(vm_vendors, bios_description)) == BARE_TO_METAL) {
		if ((result = find_in_map(vm_vendors, bios_vendor)) == BARE_TO_METAL) {
			if ((result = find_in_map(vm_vendors, sys_vendor)) == BARE_TO_METAL) {
				if ((result = find_in_map(virtual_cpu_names, m_cpu_info.vendor())) == BARE_TO_METAL) {
					result = find_in_map(virtual_cpu_names, m_cpu_info.brand());
				}
			}
		}
	}
	if (result == BARE_TO_METAL) {
		if (m_cpu_info.is_hypervisor_set() || is_cloud()) {
			result = V_OTHER;
		}
	}
	return result;
}